

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

void deqp::gles3::Functional::getAffineTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  float fVar1;
  float fVar2;
  reference pvVar3;
  float *pfVar4;
  Vector<float,_3> local_f4;
  undefined1 local_e8 [8];
  Vec3 p3;
  undefined1 local_d0 [8];
  Vec3 p2;
  undefined1 local_b8 [8];
  Vec3 p1;
  undefined1 local_a0 [8];
  Vec3 p0;
  Matrix<float,_3,_3> local_88;
  Matrix<float,_3,_3> local_64;
  undefined1 local_40 [8];
  Mat3 rotMatrix;
  float angleY;
  float angleX;
  int cellNdx_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  getBasicTexCoord3D(dst,cellNdx);
  rotMatrix.m_data.m_data[2].m_data[2] = (float)cellNdx * 0.0625 * 6.2831855 + 0.0;
  rotMatrix.m_data.m_data[2].m_data[1] = (float)cellNdx * 0.03125 * 6.2831855 + 1.0;
  tcu::rotationMatrixX(&local_64,rotMatrix.m_data.m_data[2].m_data[2]);
  tcu::rotationMatrixY(&local_88,rotMatrix.m_data.m_data[2].m_data[1]);
  tcu::operator*((Matrix<float,_3,_3> *)local_40,&local_64,&local_88);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_88);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_64);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  fVar2 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p1.m_data + 1),fVar1,fVar2,*pvVar3);
  tcu::operator*((tcu *)local_a0,(Matrix<float,_3,_3> *)local_40,(Vector<float,_3> *)(p1.m_data + 1)
                );
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  fVar2 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p2.m_data + 1),fVar1,fVar2,*pvVar3);
  tcu::operator*((tcu *)local_b8,(Matrix<float,_3,_3> *)local_40,(Vector<float,_3> *)(p2.m_data + 1)
                );
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  fVar2 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,8);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p3.m_data + 1),fVar1,fVar2,*pvVar3);
  tcu::operator*((tcu *)local_d0,(Matrix<float,_3,_3> *)local_40,(Vector<float,_3> *)(p3.m_data + 1)
                );
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,9);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,10);
  fVar2 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
  tcu::Vector<float,_3>::Vector(&local_f4,fVar1,fVar2,*pvVar3);
  tcu::operator*((tcu *)local_e8,(Matrix<float,_3,_3> *)local_40,&local_f4);
  pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_a0);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_a0);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_a0);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_b8);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_b8);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_b8);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_d0);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_d0);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_d0);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,8);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_e8);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,9);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_e8);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,10);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_e8);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
  *pvVar3 = fVar1;
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_40);
  return;
}

Assistant:

static void getAffineTexCoord3D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord3D(dst, cellNdx);

	// Rotate based on cell index.
	float		angleX		= 0.0f + 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	float		angleY		= 1.0f + 2.0f*DE_PI * ((float)cellNdx / 32.0f);
	tcu::Mat3	rotMatrix	= tcu::rotationMatrixX(angleX) * tcu::rotationMatrixY(angleY);

	Vec3		p0			= rotMatrix * Vec3(dst[0], dst[ 1], dst[ 2]);
	Vec3		p1			= rotMatrix * Vec3(dst[3], dst[ 4], dst[ 5]);
	Vec3		p2			= rotMatrix * Vec3(dst[6], dst[ 7], dst[ 8]);
	Vec3		p3			= rotMatrix * Vec3(dst[9], dst[10], dst[11]);

	dst[0] = p0.x();	dst[ 1] = p0.y();	dst[ 2] = p0.z();
	dst[3] = p1.x();	dst[ 4] = p1.y();	dst[ 5] = p1.z();
	dst[6] = p2.x();	dst[ 7] = p2.y();	dst[ 8] = p2.z();
	dst[9] = p3.x();	dst[10] = p3.y();	dst[11] = p3.z();
}